

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triple_buffer.hpp
# Opt level: O1

int __thiscall TripleBuffer<Control>::swapBackIfReady(TripleBuffer<Control> *this)

{
  int iVar1;
  Control *pCVar2;
  unique_lock<std::mutex> ul;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar1 = this->count;
  if (0 < iVar1) {
    pCVar2 = this->back;
    this->back = this->middle;
    this->middle = pCVar2;
  }
  this->count = 0;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return iVar1;
}

Assistant:

int swapBackIfReady() {
    unique_lock<mutex> ul(m);
    if (count > 0) swap(back, middle);
    int r = count;
    count = 0;
    return r;
  }